

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

HTTPResponse * processJS(HTTPRequest *req)

{
  HTTPResponse *in_RDI;
  string *in_stack_000001c0;
  string *in_stack_000001c8;
  string *in_stack_000001d0;
  int in_stack_000001dc;
  HTTPResponse *in_stack_000001e0;
  string *in_stack_000001f8;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  readFile(in_stack_000001f8);
  HTTPResponse::HTTPResponse
            (in_stack_000001e0,in_stack_000001dc,in_stack_000001d0,in_stack_000001c8,
             in_stack_000001c0);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
         *)0x1060fb);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return in_RDI;
}

Assistant:

HTTPResponse processJS(HTTPRequest &req)
{
    return HTTPResponse(200, "OK", "text/javascript", readFile(req.filepath).first);
}